

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_parameterization_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::SurfaceVertexParameterizationQuantity::buildVertexInfoGUI
          (SurfaceVertexParameterizationQuantity *this,size_t vInd)

{
  undefined1 auVar1 [16];
  vec<2,_float,_(glm::qualifier)0> vVar2;
  undefined8 extraout_XMM0_Qb;
  
  vVar2 = render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getValue
                    (&(this->super_SurfaceParameterizationQuantity).
                      super_ParameterizationQuantity<polyscope::SurfaceParameterizationQuantity>.
                      coords,vInd);
  ImGui::TextUnformatted
            ((this->super_SurfaceParameterizationQuantity).super_SurfaceMeshQuantity.
             super_QuantityS<polyscope::SurfaceMesh>.super_Quantity.name._M_dataplus._M_p,
             (char *)0x0);
  ImGui::NextColumn();
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_4_ = vVar2.field_0;
  auVar1._4_4_ = vVar2.field_1;
  auVar1 = vmovshdup_avx(auVar1);
  ImGui::Text("<%g,%g>",(double)vVar2.field_0.x,(double)auVar1._0_4_);
  ImGui::NextColumn();
  return;
}

Assistant:

void SurfaceVertexParameterizationQuantity::buildVertexInfoGUI(size_t vInd) {

  glm::vec2 coord = coords.getValue(vInd);

  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();
  ImGui::Text("<%g,%g>", coord.x, coord.y);
  ImGui::NextColumn();
}